

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

bool I_InitNetwork(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  byte local_19;
  char *v;
  int i;
  
  memset(&doomcom,0,0x36c4);
  pcVar4 = DArgs::CheckValue(Args,"-dup");
  if (pcVar4 == (char *)0x0) {
    doomcom.ticdup = 1;
  }
  else {
    iVar2 = atoi(pcVar4);
    iVar2 = clamp<int>(iVar2,1,5);
    doomcom.ticdup = (SWORD)iVar2;
  }
  pcVar4 = DArgs::CheckValue(Args,"-port");
  if (pcVar4 != (char *)0x0) {
    uVar3 = atoi(pcVar4);
    DOOMPORT = (u_short)uVar3;
    Printf("using alternate port %i\n",(ulong)(uVar3 & 0xffff));
  }
  iVar2 = DArgs::CheckParm(Args,"-host",1);
  if (iVar2 == 0) {
    iVar2 = DArgs::CheckParm(Args,"-join",1);
    if (iVar2 == 0) {
      doomcom.id = 0x12345678;
      doomcom.numnodes = 1;
      doomcom.consoleplayer = 0;
      doomcom.numplayers = 1;
      netgame = false;
      multiplayer = false;
      return false;
    }
    JoinGame(iVar2);
  }
  else {
    HostGame(iVar2);
  }
  if (doomcom.numnodes < 3) {
    v._7_1_ = false;
  }
  else {
    local_19 = 1;
    if (doomcom.numnodes < 4) {
      bVar1 = NodesOnSameNetwork();
      local_19 = bVar1 ^ 0xff;
    }
    v._7_1_ = (bool)(local_19 & 1);
  }
  return v._7_1_;
}

Assistant:

bool I_InitNetwork (void)
{
	int i;
	const char *v;

	memset (&doomcom, 0, sizeof(doomcom));

	// set up for network
	v = Args->CheckValue ("-dup");
	if (v)
	{
		doomcom.ticdup = clamp (atoi (v), 1, MAXTICDUP);
	}
	else
	{
		doomcom.ticdup = 1;
	}

	v = Args->CheckValue ("-port");
	if (v)
	{
		DOOMPORT = atoi (v);
		Printf ("using alternate port %i\n", DOOMPORT);
	}

	// parse network game options,
	//		player 1: -host <numplayers>
	//		player x: -join <player 1's address>
	if ( (i = Args->CheckParm ("-host")) )
	{
		HostGame (i);
	}
	else if ( (i = Args->CheckParm ("-join")) )
	{
		JoinGame (i);
	}
	else
	{
		// single player game
		netgame = false;
		multiplayer = false;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return false;
	}
	if (doomcom.numnodes < 3)
	{ // Packet server mode with only two players is effectively the same as
	  // peer-to-peer but with some slightly larger packets.
		return false;
	}
	return doomcom.numnodes > 3 || !NodesOnSameNetwork();
}